

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>
               (Federate *fed,basic_value<toml::type_config> *data,Filter *iface)

{
  string_view info_00;
  string_view defVal;
  anon_class_16_2_14a9c628 callback;
  bool bVar1;
  Federate *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_00000008;
  value *in_stack_00000010;
  string info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  anon_class_1_0_00000001 *in_stack_fffffffffffffd68;
  Interface *in_stack_fffffffffffffd70;
  size_t in_stack_fffffffffffffd78;
  string *in_stack_fffffffffffffd80;
  value *in_stack_fffffffffffffd88;
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffd90;
  allocator<char> *__a;
  Federate *in_stack_fffffffffffffd98;
  value *in_stack_fffffffffffffda0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_211 [40];
  allocator<char> local_1e9 [33];
  Federate *local_1c8;
  allocator<char> local_1b9;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  basic_value<toml::type_config> *in_stack_fffffffffffffe58;
  anon_class_8_1_a8116966 in_stack_fffffffffffffe60;
  allocator<char> local_191 [33];
  Federate *local_170;
  allocator<char> local_168 [32];
  __sv_type local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  allocator<char> local_119 [65];
  Federate *local_d8;
  string *in_stack_ffffffffffffff88;
  value *in_stack_ffffffffffffff90;
  Filter *in_stack_ffffffffffffff98;
  allocator<char> local_39 [33];
  Federate *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,
             (allocator<char> *)in_stack_fffffffffffffd90);
  callback.fed = local_18;
  callback.iface = in_stack_ffffffffffffff98;
  addTargets<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_1_>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,callback);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(local_39);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_2_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::function<int(std::__cxx11::string_const&)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_3_,void>
            ((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_d8 = local_18;
  std::function<void(int,int)>::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(int,int)_1_,void>
            ((function<void_(int,_int)> *)in_stack_fffffffffffffd70,
             (anon_class_8_1_a8116966 *)in_stack_fffffffffffffd68);
  processOptions(in_stack_fffffffffffffda0,
                 (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                 (function<void_(int,_int)> *)in_stack_fffffffffffffd88);
  std::function<void_(int,_int)>::~function((function<void_(int,_int)> *)0x2147e0);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x2147ed);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x2147fa);
  this = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)in_stack_fffffffffffffd98,(allocator<char> *)in_stack_fffffffffffffd90);
  local_138 = 0;
  uStack_130 = 0;
  defVal._M_str = (char *)in_stack_fffffffffffffd98;
  defVal._M_len = (size_t)in_stack_fffffffffffffd90;
  fileops::getOrDefault(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,defVal);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(local_119);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x214892);
  if (!bVar1) {
    in_stack_fffffffffffffd98 = local_18;
    local_148 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd60);
    info_00._M_str = (char *)in_stack_fffffffffffffd80;
    info_00._M_len = in_stack_fffffffffffffd78;
    Interface::setInfo(in_stack_fffffffffffffd70,info_00);
  }
  local_170 = local_18;
  __a = local_168;
  std::
  function<void(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_fffffffffffffd70,(anon_class_8_1_a8116966 *)in_stack_fffffffffffffd68);
  loadTags(in_stack_00000010,in_stack_00000008);
  std::
  function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x214a25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffffd98,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffffd98,__a);
  local_1c8 = local_18;
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string(in_stack_fffffffffffffd60);
  std::allocator<char>::~allocator(local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffffd98,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_stack_fffffffffffffd98,__a);
  addTargetVariations<toml::basic_value<toml::type_config>,helics::loadOptions<toml::basic_value<toml::type_config>,helics::Filter>(helics::Federate*,toml::basic_value<toml::type_config>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe60);
  std::__cxx11::string::~string(local_10);
  std::allocator<char>::~allocator(local_211);
  std::__cxx11::string::~string(local_10);
  std::allocator<char>::~allocator(local_1e9);
  std::__cxx11::string::~string(local_10);
  return;
}

Assistant:

static void loadOptions(Federate* fed, const Inp& data, INTERFACE& iface)
{
    addTargets(data, "flags", [&iface, fed](const std::string& target) {
        auto oindex = getOptionIndex((target.front() != '-') ? target : target.substr(1));
        const int val = (target.front() != '-') ? 1 : 0;
        if (oindex == HELICS_INVALID_OPTION_INDEX) {
            fed->logWarningMessage(target + " is not a recognized flag");
            return;
        }
        iface.setOption(oindex, val);
    });
    processOptions(
        data,
        [](const std::string& option) { return getOptionIndex(option); },
        [](const std::string& value) { return getOptionValue(value); },
        [&iface](int32_t option, int32_t value) { iface.setOption(option, value); });

    auto info = fileops::getOrDefault(data, "info", emptyStr);
    if (!info.empty()) {
        iface.setInfo(info);
    }
    loadTags(data, [&iface](std::string_view tagname, std::string_view tagvalue) {
        iface.setTag(tagname, tagvalue);
    });

    addTargetVariations(data, "source", "targets", [&iface](const std::string& target) {
        iface.addSourceTarget(target);
    });
    addTargetVariations(data, "destination", "targets", [&iface](const std::string& target) {
        iface.addDestinationTarget(target);
    });
}